

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O2

void Assimp::ArmaturePopulate::BuildBoneList
               (aiNode *current_node,aiNode *root_node,aiScene *scene,
               vector<aiBone_*,_std::allocator<aiBone_*>_> *bones)

{
  aiNode *current_node_00;
  aiMesh *paVar1;
  uint __line;
  __normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_> _Var2;
  ulong uVar3;
  char *__assertion;
  ulong uVar4;
  ulong uVar5;
  aiBone *bone;
  
  if (scene == (aiScene *)0x0) {
    __assertion = "scene";
    __line = 0x70;
  }
  else {
    uVar3 = 0;
    while( true ) {
      if (current_node->mNumChildren <= (uint)uVar3) {
        return;
      }
      current_node_00 = current_node->mChildren[uVar3];
      if (current_node_00 == (aiNode *)0x0) break;
      for (uVar4 = 0; (uint)uVar4 < current_node_00->mNumMeshes; uVar4 = (ulong)((uint)uVar4 + 1)) {
        if (current_node_00->mMeshes == (uint *)0x0) {
          __assertion = "child->mMeshes";
          __line = 0x77;
          goto LAB_003c1fad;
        }
        paVar1 = scene->mMeshes[current_node_00->mMeshes[uVar4]];
        if (paVar1 == (aiMesh *)0x0) {
          __assertion = "mesh";
          __line = 0x7a;
          goto LAB_003c1fad;
        }
        for (uVar5 = 0; uVar5 < paVar1->mNumBones; uVar5 = uVar5 + 1) {
          bone = paVar1->mBones[uVar5];
          if (bone == (aiBone *)0x0) {
            __assertion = "bone";
            __line = 0x7e;
            goto LAB_003c1fad;
          }
          _Var2 = std::
                  __find_if<__gnu_cxx::__normal_iterator<aiBone**,std::vector<aiBone*,std::allocator<aiBone*>>>,__gnu_cxx::__ops::_Iter_equals_val<aiBone*const>>
                            ((bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>).
                             _M_impl.super__Vector_impl_data._M_start,
                             (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish,&bone);
          if (_Var2._M_current ==
              (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<aiBone_*,_std::allocator<aiBone_*>_>::push_back(bones,&bone);
          }
        }
      }
      BuildBoneList(current_node_00,root_node,scene,bones);
      uVar3 = (ulong)((uint)uVar3 + 1);
    }
    __assertion = "child";
    __line = 0x73;
  }
LAB_003c1fad:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                ,__line,
                "static void Assimp::ArmaturePopulate::BuildBoneList(aiNode *, const aiNode *, const aiScene *, std::vector<aiBone *> &)"
               );
}

Assistant:

void ArmaturePopulate::BuildBoneList(aiNode *current_node,
                                     const aiNode *root_node,
                                     const aiScene *scene,
                                     std::vector<aiBone *> &bones) {
  ai_assert(scene);
  for (unsigned int nodeId = 0; nodeId < current_node->mNumChildren; ++nodeId) {
    aiNode *child = current_node->mChildren[nodeId];
    ai_assert(child);

    // check for bones
    for (unsigned int meshId = 0; meshId < child->mNumMeshes; ++meshId) {
      ai_assert(child->mMeshes);
      unsigned int mesh_index = child->mMeshes[meshId];
      aiMesh *mesh = scene->mMeshes[mesh_index];
      ai_assert(mesh);

      for (unsigned int boneId = 0; boneId < mesh->mNumBones; ++boneId) {
        aiBone *bone = mesh->mBones[boneId];
        ai_assert(bone);

        // duplicate meshes exist with the same bones sometimes :)
        // so this must be detected
        if (std::find(bones.begin(), bones.end(), bone) == bones.end()) {
          // add the element once
          bones.push_back(bone);
        }
      }

      // find mesh and get bones
      // then do recursive lookup for bones in root node hierarchy
    }

    BuildBoneList(child, root_node, scene, bones);
  }
}